

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  undefined1 in_R8B;
  string_view input;
  string local_48;
  undefined1 local_28 [16];
  java *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  (anonymous_namespace)::FieldName_abi_cxx11_(&local_48,(_anonymous_namespace_ *)this,field);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  input._M_len = local_28._8_8_;
  input._M_str = (char *)0x0;
  UnderscoresToCamelCase_abi_cxx11_(__return_storage_ptr__,local_28._0_8_,input,(bool)in_R8B);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(const FieldDescriptor* field) {
  return UnderscoresToCamelCase(FieldName(field), false);
}